

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  FILE *__stream;
  size_t *extraout_RDX;
  size_t *__n;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  char *end;
  int line_terminator_len;
  undefined1 local_868 [8];
  stream_line_reader line_reader;
  char buf [2048];
  int bufsiz;
  Headers *headers_local;
  Stream *strm_local;
  
  __stream = (FILE *)0x800;
  stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_868,strm,
             line_reader.glowable_buffer_.field_2._M_local_buf + 8,0x800);
  __n = extraout_RDX;
  do {
    do {
      uVar2 = stream_line_reader::getline
                        ((stream_line_reader *)local_868,(char **)strm,__n,__stream);
      if ((uVar2 & 1) == 0) {
        strm_local._7_1_ = false;
LAB_0019028e:
        stream_line_reader::~stream_line_reader((stream_line_reader *)local_868);
        return strm_local._7_1_;
      }
      bVar1 = stream_line_reader::end_with_crlf((stream_line_reader *)local_868);
      __n = extraout_RDX_00;
    } while (!bVar1);
    sVar3 = stream_line_reader::size((stream_line_reader *)local_868);
    if (sVar3 == 2) {
      strm_local._7_1_ = true;
      goto LAB_0019028e;
    }
    sVar3 = stream_line_reader::size((stream_line_reader *)local_868);
    if (0x2000 < sVar3) {
      strm_local._7_1_ = false;
      goto LAB_0019028e;
    }
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_868);
    sVar3 = stream_line_reader::size((stream_line_reader *)local_868);
    __stream = (FILE *)0x2;
    strm = (Stream *)(pcVar4 + (sVar3 - 2));
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_868);
    parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
              (pcVar4,(char *)strm,(anon_class_8_1_b2c1a266)headers);
    __n = extraout_RDX_01;
  } while( true );
}

Assistant:

inline bool read_headers(Stream &strm, Headers &headers) {
  const auto bufsiz = 2048;
  char buf[bufsiz];
  stream_line_reader line_reader(strm, buf, bufsiz);

  for (;;) {
    if (!line_reader.getline()) { return false; }

    // Check if the line ends with CRLF.
    auto line_terminator_len = 2;
    if (line_reader.end_with_crlf()) {
      // Blank line indicates end of headers.
      if (line_reader.size() == 2) { break; }
#ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
    } else {
      // Blank line indicates end of headers.
      if (line_reader.size() == 1) { break; }
      line_terminator_len = 1;
    }
#else
    } else {
      continue; // Skip invalid line.
    }